

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_column_data.cpp
# Opt level: O1

void __thiscall
duckdb::PartitionedColumnData::AppendInternal<true>
          (PartitionedColumnData *this,PartitionedColumnDataAppendState *state,DataChunk *input)

{
  size_type __n;
  _Head_base<0UL,_duckdb::list_entry_t_*,_false> _Var1;
  long lVar2;
  long lVar3;
  sel_t *psVar4;
  ulong uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  idx_t iVar6;
  idx_t iVar7;
  int iVar8;
  DataChunk *this_01;
  reference this_02;
  type this_03;
  reference this_04;
  type this_05;
  reference this_06;
  type state_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SelectionVector partition_sel;
  const_iterator it;
  SelectionVector local_98;
  DataChunk *local_78;
  PartitionedColumnDataAppendState *local_70;
  fixed_size_map_iterator<duckdb::list_entry_t,_true> local_68;
  vector<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>,_true>
  *local_50;
  vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
  *local_48;
  vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
  *local_40;
  fixed_size_map_t<duckdb::list_entry_t> *local_38;
  
  local_68.map = &state->fixed_partition_entries;
  local_98.sel_vector = (sel_t *)0x0;
  local_98.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_98.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.entry_idx = 0;
  local_68.idx_in_entry = 0;
  local_78 = input;
  local_70 = state;
  local_38 = local_68.map;
  if ((*(state->fixed_partition_entries).occupied.validity_mask & 1) == 0) {
    fixed_size_map_iterator<duckdb::list_entry_t,_true>::operator++(&local_68);
  }
  local_40 = &this->partitions;
  local_48 = &local_70->partition_buffers;
  local_50 = &local_70->partition_append_states;
  this_01 = &local_70->slice_chunk;
  while( true ) {
    if (((uint)local_38->capacity & 7) == local_68.idx_in_entry &&
        local_38->capacity >> 3 == local_68.entry_idx) break;
    __n = local_68.idx_in_entry + local_68.entry_idx * 8;
    this_02 = vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
              ::operator[](local_40,__n);
    this_03 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
              ::operator*(this_02);
    this_04 = vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
              ::operator[](local_48,__n);
    this_05 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                        (this_04);
    this_06 = vector<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>,_true>
              ::operator[](local_50,__n);
    state_00 = unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>
               ::operator*(this_06);
    iVar7 = local_68.idx_in_entry;
    iVar6 = local_68.entry_idx;
    this_00._M_pi =
         local_98.selection_data.internal.
         super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    _Var1._M_head_impl =
         ((local_68.map)->values).
         super_unique_ptr<duckdb::list_entry_t[],_std::default_delete<duckdb::list_entry_t[]>_>._M_t
         .super___uniq_ptr_impl<duckdb::list_entry_t,_std::default_delete<duckdb::list_entry_t[]>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::list_entry_t_*,_std::default_delete<duckdb::list_entry_t[]>_>
         .super__Head_base<0UL,_duckdb::list_entry_t_*,_false>._M_head_impl;
    lVar2 = _Var1._M_head_impl[local_68.entry_idx * 8 + local_68.idx_in_entry].offset;
    lVar3 = _Var1._M_head_impl[local_68.entry_idx * 8 + local_68.idx_in_entry].length;
    psVar4 = (local_70->partition_sel).sel_vector;
    local_98.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_98.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
    uVar5 = _Var1._M_head_impl[iVar6 * 8 + iVar7].length;
    local_98.sel_vector = psVar4 + (lVar2 - lVar3);
    iVar8 = (*this->_vptr_PartitionedColumnData[2])();
    if (uVar5 < CONCAT44(extraout_var,iVar8) >> 1) {
      DataChunk::Append(this_05,local_78,false,&local_98,
                        _Var1._M_head_impl[iVar6 * 8 + iVar7].length);
      uVar5 = this_05->count;
      iVar8 = (*this->_vptr_PartitionedColumnData[2])();
      if (CONCAT44(extraout_var_00,iVar8) >> 1 <= uVar5) {
        ColumnDataCollection::Append(this_03,state_00,this_05);
        DataChunk::Reset(this_05);
        iVar8 = (*this->_vptr_PartitionedColumnData[2])();
        this_05->capacity = CONCAT44(extraout_var_01,iVar8);
      }
    }
    else {
      DataChunk::Reset(this_01);
      DataChunk::Slice(this_01,local_78,&local_98,_Var1._M_head_impl[iVar6 * 8 + iVar7].length,0);
      ColumnDataCollection::Append(this_03,state_00,this_01);
    }
    fixed_size_map_iterator<duckdb::list_entry_t,_true>::operator++(&local_68);
  }
  if (local_98.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void PartitionedColumnData::AppendInternal(PartitionedColumnDataAppendState &state, DataChunk &input) {
	using GETTER = TemplatedMapGetter<list_entry_t, fixed>;
	const auto &partition_entries = state.GetMap<fixed>();

	// Loop through the partitions to append the new data to the partition buffers, and flush the buffers if necessary
	SelectionVector partition_sel;
	for (auto it = partition_entries.begin(); it != partition_entries.end(); ++it) {
		const auto &partition_index = GETTER::GetKey(it);

		// Partition, buffer, and append state for this partition index
		auto &partition = *partitions[partition_index];
		auto &partition_buffer = *state.partition_buffers[partition_index];
		auto &partition_append_state = *state.partition_append_states[partition_index];

		// Length and offset into the selection vector for this chunk, for this partition
		const auto &partition_entry = GETTER::GetValue(it);
		const auto &partition_length = partition_entry.length;
		const auto partition_offset = partition_entry.offset - partition_length;

		// Create a selection vector for this partition using the offset into the single selection vector
		partition_sel.Initialize(state.partition_sel.data() + partition_offset);

		if (partition_length >= HalfBufferSize()) {
			// Slice the input chunk using the selection vector
			state.slice_chunk.Reset();
			state.slice_chunk.Slice(input, partition_sel, partition_length);

			// Append it to the partition directly
			partition.Append(partition_append_state, state.slice_chunk);
		} else {
			// Append the input chunk to the partition buffer using the selection vector
			partition_buffer.Append(input, false, &partition_sel, partition_length);

			if (partition_buffer.size() >= HalfBufferSize()) {
				// Next batch won't fit in the buffer, flush it to the partition
				partition.Append(partition_append_state, partition_buffer);
				partition_buffer.Reset();
				partition_buffer.SetCapacity(BufferSize());
			}
		}
	}
}